

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadString
          (EpsCopyInputStream *this,char *ptr,int size,string *s)

{
  int iVar1;
  void *__dest;
  char *z;
  string *s_local;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  iVar1 = BytesAvailable(this,ptr);
  if (iVar1 < size) {
    this_local = (EpsCopyInputStream *)ReadStringFallback(this,ptr,size,s);
  }
  else {
    absl::lts_20250127::strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
              (s,(long)size);
    __dest = (void *)std::__cxx11::string::operator[]((ulong)s);
    memcpy(__dest,ptr,(long)size);
    this_local = (EpsCopyInputStream *)(ptr + size);
  }
  return (char *)this_local;
}

Assistant:

[[nodiscard]] const char* ReadString(const char* ptr, int size,
                                       std::string* s) {
    if (size <= BytesAvailable(ptr)) {
      // Fundamentally we just want to do assign to the string.
      // However micro-benchmarks regress on string reading cases. So we copy
      // the same logic from the old CodedInputStream ReadString. Note: as of
      // Apr 2021, this is still a significant win over `assign()`.
      absl::strings_internal::STLStringResizeUninitialized(s, size);
      char* z = &(*s)[0];
      memcpy(z, ptr, size);
      return ptr + size;
    }
    return ReadStringFallback(ptr, size, s);
  }